

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O1

Gia_Man_t * Gia_ManBalanceLut(Gia_Man_t *p,int nLutSize,int nCutNum,int fVerbose)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  int *__s;
  Gia_Obj_t *pGVar11;
  Bal_Man_t *p_01;
  Gia_Man_t *p_02;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  pGVar6 = Gia_ManDupMuxes(p,2);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  Gia_ManFillValue(pGVar6);
  Gia_ManCreateRefs(pGVar6);
  p_00 = Gia_ManStart((pGVar6->nObjs * 3) / 2);
  pcVar2 = pGVar6->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = pGVar6->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  iVar1 = p_00->nObjsAlloc;
  puVar9 = (uint *)calloc((long)iVar1,4);
  p_00->pMuxes = puVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar12 = iVar1;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar12;
  if (iVar12 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar12 << 2);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  p_00->vLevels = pVVar10;
  pGVar6->pObjs->Value = 0;
  pVVar10 = pGVar6->vCis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar15];
      if (((long)iVar1 < 0) || (pGVar6->nObjs <= iVar1)) goto LAB_00700e22;
      pGVar3 = pGVar6->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar17 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00700e03;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00700e03;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar10 = pGVar6->vCis;
    } while (lVar15 < pVVar10->nSize);
  }
  p_01 = Bal_ManAlloc(pGVar6,p_00,nLutSize,nCutNum,fVerbose);
  Gia_ManHashStart(p_00);
  pVVar10 = pGVar6->vCos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar15];
      if (((long)iVar1 < 0) || (pGVar6->nObjs <= iVar1)) goto LAB_00700e22;
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = pGVar6->pObjs + iVar1;
      Gia_ManBalance_rec(p_00,pGVar6,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar15 = lVar15 + 1;
      pVVar10 = pGVar6->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pGVar6->vCos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar15];
      if (((long)iVar1 < 0) || (pGVar6->nObjs <= iVar1)) goto LAB_00700e22;
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = pGVar6->pObjs + iVar1;
      uVar5 = *(undefined8 *)pGVar3;
      uVar18 = pGVar3[-(ulong)((uint)uVar5 & 0x1fffffff)].Value;
      if ((int)uVar18 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar19 = uVar18 >> 1;
      if (p_00->nObjs <= (int)uVar19) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p_00->pObjs + uVar19) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar19) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar17 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar17 | 0x80000000;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_00700e03:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = (ulong)(((uint)((int)pGVar11 - (int)pGVar4) >> 2) * -0x55555555 - uVar19 & 0x1fffffff
                      );
      uVar16 = (ulong)((uVar18 << 0x1d ^ (uint)uVar5) & 0x20000000);
      *(ulong *)pGVar11 = uVar16 | uVar17 & 0xffffffffc0000000 | 0x80000000 | uVar13;
      *(ulong *)pGVar11 =
           uVar16 | uVar17 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00700e03;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_00700e03;
      pGVar3->Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar10 = pGVar6->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  lVar15 = (long)p_00->vCos->nSize;
  if (lVar15 < 1) {
    uVar17 = 0;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      iVar1 = p_00->vCos->pArray[lVar14];
      if (((long)iVar1 < 0) || (p_00->nObjs <= iVar1)) {
LAB_00700e22:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      uVar18 = iVar1 - (*(uint *)(p_00->pObjs + iVar1) & 0x1fffffff);
      if (((int)uVar18 < 0) || (p_01->vCosts->nSize <= (int)uVar18)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar18 = p_01->vCosts->pArray[uVar18] >> 4;
      if ((int)uVar17 <= (int)uVar18) {
        uVar17 = (ulong)uVar18;
      }
      lVar14 = lVar14 + 1;
    } while (lVar15 != lVar14);
  }
  printf("Best delay = %d\n",uVar17);
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGVar6->nRegs);
  Bal_ManFree(p_01);
  p_02 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (fVerbose != 0) {
    Gia_ManPrintStats(p_02,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar6);
  pGVar6 = Gia_ManDupNoMuxes(p_02,0);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(p_02);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose )
{
    Gia_Man_t * pNew, * pNew1, * pNew2;
    if ( fVerbose )      Gia_ManPrintStats( p, NULL );
    pNew = Gia_ManDupMuxes( p, 2 );
    if ( fVerbose )      Gia_ManPrintStats( pNew, NULL );
    pNew1 = Gia_ManBalanceInt( pNew, nLutSize, nCutNum, fVerbose );
    if ( fVerbose )      Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    if ( fVerbose )      Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    return pNew2;
}